

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O1

bool mpt::assign<mpt::client*>(client **from,int type,void *ptr)

{
  bool bVar1;
  int iVar2;
  
  if (type < 1) {
    return false;
  }
  if (type_properties<mpt::client_*>::id::traits == (named_traits *)0x0) {
    type_properties<mpt::client_*>::id::traits = (named_traits *)mpt_client_type_traits();
    if (type_properties<mpt::client_*>::id::traits == (named_traits *)0x0) {
      iVar2 = -3;
      goto LAB_0012b95f;
    }
  }
  iVar2 = (int)type_properties<mpt::client_*>::id::traits->type;
LAB_0012b95f:
  if (iVar2 == type) {
    bVar1 = true;
    if (ptr != (void *)0x0) {
      *(client **)ptr = *from;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool assign(const T &from, int type, void *ptr) {
	/* bad arg or type ID registration error */
	if (type <= 0 || type != type_properties<T>::id(true)) {
		return false;
	}
	if (ptr) {
		*static_cast<T *>(ptr) = from;
	}
	return true;
}